

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

Script * cfd::core::ScriptUtil::CreatePegoutLogkingScript
                   (Script *__return_storage_ptr__,BlockHash *genesisblock_hash,
                   Script *parent_locking_script,Pubkey *btc_pubkey_bytes,ByteData *whitelist_proof)

{
  bool bVar1;
  size_t sVar2;
  ScriptBuilder builder;
  ScriptBuilder local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  local_60._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00647848;
  local_60.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ScriptBuilder::AppendOperator(&local_60,(ScriptOperator *)ScriptOperator::OP_RETURN);
  BlockHash::GetData((ByteData *)&local_40,genesisblock_hash);
  ScriptBuilder::AppendData(&local_60,(ByteData *)&local_40);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  ScriptBuilder::AppendData(&local_60,parent_locking_script);
  bVar1 = Pubkey::IsValid(btc_pubkey_bytes);
  if (bVar1) {
    sVar2 = ByteData::GetDataSize(whitelist_proof);
    if (sVar2 != 0) {
      ScriptBuilder::AppendData(&local_60,btc_pubkey_bytes);
      ScriptBuilder::AppendData(&local_60,whitelist_proof);
    }
  }
  ScriptBuilder::Build(__return_storage_ptr__,&local_60);
  ScriptBuilder::~ScriptBuilder(&local_60);
  return __return_storage_ptr__;
}

Assistant:

Script ScriptUtil::CreatePegoutLogkingScript(
    const BlockHash& genesisblock_hash, const Script& parent_locking_script,
    const Pubkey& btc_pubkey_bytes, const ByteData& whitelist_proof) {
  // create script
  ScriptBuilder builder;
  builder.AppendOperator(ScriptOperator::OP_RETURN);
  builder.AppendData(genesisblock_hash.GetData());
  builder.AppendData(parent_locking_script);
  if (btc_pubkey_bytes.IsValid() && (whitelist_proof.GetDataSize() > 0)) {
    builder.AppendData(btc_pubkey_bytes);
    builder.AppendData(whitelist_proof);
  }
  Script locking_script = builder.Build();
  return locking_script;
}